

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenlibClientSubscription.c
# Opt level: O2

int GenlibClientSubscription_assign(GenlibClientSubscription *p,GenlibClientSubscription *q)

{
  int iVar1;
  
  if (p != q) {
    p->m_RenewEventId = q->m_RenewEventId;
    iVar1 = GenlibClientSubscription_set_SID(p,q->m_SID);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = GenlibClientSubscription_set_ActualSID(p,q->m_ActualSID);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = GenlibClientSubscription_set_EventURL(p,q->m_EventURL);
    if (iVar1 == 0) {
      return 0;
    }
    p->m_Next = q->m_Next;
  }
  return 1;
}

Assistant:

int GenlibClientSubscription_assign(
	GenlibClientSubscription *p, const GenlibClientSubscription *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     GenlibClientSubscription_set_RenewEventId(
			     p, GenlibClientSubscription_get_RenewEventId(q));
		ok = ok && GenlibClientSubscription_set_SID(
				   p, GenlibClientSubscription_get_SID(q));
		ok = ok && GenlibClientSubscription_set_ActualSID(p,
				   GenlibClientSubscription_get_ActualSID(q));
		ok = ok && GenlibClientSubscription_set_EventURL(
				   p, GenlibClientSubscription_get_EventURL(q));
		ok = ok && GenlibClientSubscription_set_Next(
				   p, GenlibClientSubscription_get_Next(q));
	}

	return ok;
}